

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Gia_Man_t *
Gia_PolynCoreDupTree
          (Gia_Man_t *p,Vec_Int_t *vAddCos,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,int fAddCones)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int fAddCones_local;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vAddCos_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                  ,0x15d,
                  "Gia_Man_t *Gia_PolynCoreDupTree(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Gia_ManFillValue(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  if (fAddCones == 0) {
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vLeaves);
      bVar5 = false;
      if (local_44 < iVar1) {
        iVar1 = Vec_IntEntry(vLeaves,local_44);
        pGStack_40 = Gia_ManObj(p,iVar1);
        bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_40->Value = uVar2;
      local_44 = local_44 + 1;
    }
  }
  else {
    local_44 = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar5 = false;
      if (local_44 < iVar1) {
        pGStack_40 = Gia_ManCi(p,local_44);
        bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_40->Value = uVar2;
      local_44 = local_44 + 1;
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(vLeaves);
      bVar5 = false;
      if (local_44 < iVar1) {
        iVar1 = Vec_IntEntry(vLeaves,local_44);
        pGStack_40 = Gia_ManObj(p,iVar1);
        bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_PolynCoreDupTreePlus_rec(p_00,p,pGStack_40);
      pGStack_40->Value = uVar2;
      local_44 = local_44 + 1;
    }
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    bVar5 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vNodes,local_44);
      pGStack_40 = Gia_ManObj(p,iVar1);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_40);
    iLit1 = Gia_ObjFanin1Copy(pGStack_40);
    uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
    pGStack_40->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (local_44 < iVar1) {
      pGStack_40 = Gia_ManCo(p,local_44);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(pGStack_40);
    Gia_ManAppendCo(p_00,iVar1);
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAddCos);
    bVar5 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vAddCos,local_44);
      pGStack_40 = Gia_ManObj(p,iVar1);
      bVar5 = pGStack_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ManAppendCo(p_00,pGStack_40->Value);
    local_44 = local_44 + 1;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDupTree( Gia_Man_t * p, Vec_Int_t * vAddCos, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, int fAddCones )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( fAddCones )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_PolynCoreDupTreePlus_rec( pNew, p, pObj );
    }
    else
    {
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vAddCos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    return pNew;

}